

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int macro_getargs(int ip)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  char (*__s) [80];
  long lVar6;
  int local_30;
  int local_2c;
  int level;
  int arg;
  int f;
  int j;
  int i;
  char t;
  char c;
  char *ptr;
  int ip_local;
  
  if (midx == 7) {
    error("Too many nested macro calls!");
  }
  else {
    mcntstack[midx] = mcounter;
    lVar6 = (long)midx;
    midx = midx + 1;
    mstack[lVar6] = mlptr;
    _i = marg[midx];
    local_2c = 0;
    for (f = 0; ptr._0_4_ = ip, f < 9; f = f + 1) {
      marg[midx][f][0] = '\0';
    }
LAB_0010fece:
    do {
      while( true ) {
        while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)prlnbuf[(int)ptr]] & 0x2000) != 0) {
          ptr._0_4_ = (int)ptr + 1;
        }
        lVar6 = (long)(int)ptr;
        ptr._0_4_ = (int)ptr + 1;
        j._3_1_ = prlnbuf[lVar6];
        if (j._3_1_ == '\0') {
          return 1;
        }
        if (j._3_1_ != '\"') break;
LAB_0010ffc2:
        if (j._3_1_ == '\"') {
          (*(char (*) [80])*_i)[0] = '\"';
        }
        f = (int)(j._3_1_ == '\"');
        while( true ) {
          iVar3 = (int)ptr + 1;
          cVar1 = prlnbuf[(int)ptr];
          if (cVar1 == '\0') {
            error("Unterminated string!");
            return 0;
          }
          if (f == 0x50) {
            error("String too long, max. 80 characters!");
            return 0;
          }
          ptr._0_4_ = iVar3;
          if (cVar1 == j._3_1_) break;
          (*(char (*) [80])*_i)[f] = cVar1;
          f = f + 1;
        }
        if (j._3_1_ == '\"') {
          (*(char (*) [80])*_i)[f] = cVar1;
          f = f + 1;
        }
        while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)prlnbuf[(int)ptr]] & 0x2000) != 0) {
          ptr._0_4_ = (int)ptr + 1;
        }
        cVar1 = prlnbuf[(int)ptr];
        if (((cVar1 != '\0') && (cVar1 != ',')) && (cVar1 != ';')) {
          error("Syntax error!");
          return 0;
        }
        (*(char (*) [80])*_i)[f] = '\0';
      }
      if (j._3_1_ != ',') {
        if (j._3_1_ == ';') {
          return 1;
        }
        f = (int)ptr;
        if (j._3_1_ == '\\') {
          while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)prlnbuf[f]] & 0x2000) != 0) {
            f = f + 1;
          }
          if ((prlnbuf[f] == ';') || (prlnbuf[f] == '\0')) {
            if (pass == 1) {
              println();
              clearln();
            }
            iVar3 = readline();
            if (iVar3 == -1) {
              return 0;
            }
            ptr._0_4_ = 0x1a;
            goto LAB_0010fece;
          }
        }
        else if (j._3_1_ == '{') {
          j._3_1_ = '}';
          goto LAB_0010ffc2;
        }
        f = 0;
        arg = 0;
        bVar2 = false;
        local_30 = 0;
        while (j._3_1_ != '\0') {
          if (j._3_1_ == ',') {
            if (local_30 == 0) break;
          }
          else if ((j._3_1_ == '(') || (j._3_1_ == '[')) {
            local_30 = local_30 + 1;
          }
          else if ((j._3_1_ == ')') || (j._3_1_ == ']')) {
            if (local_30 != 0) {
              local_30 = local_30 + -1;
            }
          }
          else if (j._3_1_ == ';') break;
          if (bVar2) {
            if (j._3_1_ != ' ') {
              while (f < arg) {
                (*(char (*) [80])*_i)[f] = ' ';
                f = f + 1;
              }
              (*(char (*) [80])*_i)[f] = j._3_1_;
              bVar2 = false;
              f = f + 1;
            }
          }
          else if (j._3_1_ == ' ') {
            bVar2 = true;
          }
          else {
            (*(char (*) [80])*_i)[f] = j._3_1_;
            f = f + 1;
          }
          if (f == 0x50) {
            error("Macro argument string too long, max. 80 characters!");
            return 0;
          }
          arg = arg + 1;
          j._3_1_ = prlnbuf[(int)ptr];
          ptr._0_4_ = (int)ptr + 1;
        }
        (*(char (*) [80])*_i)[f] = '\0';
        ptr._0_4_ = (int)ptr + -1;
        sVar5 = strlen(*_i);
        if ((sVar5 != 0) && (local_2c != 0)) {
          iVar3 = tolower((int)(*(char (*) [80])*_i)[0]);
          if ((((char)iVar3 == 'x') || ((char)iVar3 == 'y')) &&
             (((iVar3 = strcasecmp(*_i,"x++"), iVar3 == 0 ||
               (iVar3 = strcasecmp(*_i,"y++"), iVar3 == 0)) || (sVar5 = strlen(*_i), sVar5 == 1))))
          {
            __s = marg[midx] + (local_2c + -1);
            sVar5 = strlen(*__s);
            if (0x4b < sVar5) {
              error("Macro argument string too long, max. 80 characters!");
              return 0;
            }
            strcat(*__s,",");
            strcat(*__s,marg[midx][local_2c]);
            _i = marg[midx] + local_2c;
            (*(char (*) [80])*_i)[0] = '\0';
            local_2c = local_2c + -1;
          }
        }
        goto LAB_0010fece;
      }
      local_2c = local_2c + 1;
      _i = marg[midx] + local_2c;
    } while (local_2c != 9);
    error("Too many arguments for a macro!");
  }
  return 0;
}

Assistant:

int
macro_getargs(int ip)
{
	char *ptr;
	char  c, t;
	int   i, j, f, arg;
	int   level;

	/* can not nest too much macros */
	if (midx == 7) {
		error("Too many nested macro calls!");
		return (0);
	}

	/* initialize args */
	mcntstack[midx] = mcounter;
	mstack[midx++] = mlptr;
	ptr = marg[midx][0];
	arg = 0;

	for (i = 0; i < 9; i++)
		marg[midx][i][0] = '\0';

	/* extract args */
	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[ip]))
			ip++;

		c = prlnbuf[ip++];
		switch (c) {
		/* no arg */
		case ',':
			arg++;
			ptr = marg[midx][arg];
			if (arg == 9) {
				error("Too many arguments for a macro!");
				return (0);
			}
			break;

		/* string */
		case '{':
			c = '}';
		case '\"':
			i = 0;
			if (c == '\"')
				ptr[i++] = c;
			for (;;) {
				t = prlnbuf[ip++];
				if (t == '\0') {
					error("Unterminated string!");
					return (0);
				}
				if (i == 80) {
					error("String too long, max. 80 characters!");
					return (0);
				}
				if (t == c)
					break;
				ptr[i++] = t;
			}
			if (c == '\"')
				ptr[i++] = t;

			/* skip spaces */
			while (isspace(prlnbuf[ip]))
				ip++;

			/* check end of arg */
			switch (prlnbuf[ip]) {
			case '\0':
			case ',':
			case ';':
				break;

			default:
				error("Syntax error!");
				return (0);
			}

			/* end arg string */
			ptr[i] = '\0';
			break;

		/* end of line */
		case ';':
		case '\0':
			return (1);

		/* continuation char */
		case '\\':
			/* skip spaces */
			i = ip;
			while (isspace(prlnbuf[i]))
				i++;

			/* check */
			if (prlnbuf[i] == ';' || prlnbuf[i] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return (0);

				/* rewind line pointer and continue */
				ip = SFIELD;
				break;
			}

		/* other */
		default:
			i = 0;
			j = 0;
			f = 0;
			level = 0;
			while (c) {
				if (c == ',') {
					if (level == 0)
						break;
				}
				else if ((c == '(') || (c == '[')) {
					level++;
				}
				else if ((c == ')') || (c == ']')) {
					if (level)
						level--;
				}
				else if (c == ';') {
					break;
				}
				if (f) {
					if (c != ' ') {
						while (i < j)
							ptr[i++] = ' ';
						ptr[i++] = c;
						f = 0;
					}
				}
				else if (c == ' ') {
					f = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Macro argument string too long, max. 80 characters!");
					return (0);
				}
				j++;
				c = prlnbuf[ip++];
			}
			ptr[i] = '\0';
			ip--;

			/* check if arg is X or Y */
			if (strlen(ptr) && arg) {
				c = tolower(ptr[0]);

				if ((c == 'x') || (c == 'y')) {
					if ((strcasecmp(ptr, "x++") == 0) ||
						(strcasecmp(ptr, "y++") == 0) ||
						(strlen(ptr) == 1))
					{
						arg--;
						ptr = marg[midx][arg];

						/* check string length */
						if (strlen(ptr) > 75) {
							error("Macro argument string too long, max. 80 characters!");
							return (0);
						}

						/* attach current arg to the previous one */
						strcat(ptr, ",");
						strcat(ptr, marg[midx][arg + 1]);
						ptr = marg[midx][arg + 1];
						ptr[0] = '\0';
					}
			 	}
			}
			break;
		}
	}
}